

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O1

int going_accept(int sockfd,sockaddr *addr,socklen_t *addrlen)

{
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  
  do {
    while( true ) {
      do {
        iVar1 = accept(sockfd,(sockaddr *)addr,addrlen);
        if (0 < iVar1) {
          return iVar1;
        }
      } while (iVar1 != -1);
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      if (0x46 < iVar1) break;
      if ((iVar1 != 4) && (iVar1 != 0xb)) goto LAB_001069c8;
    }
  } while ((iVar1 == 0x47) || (iVar1 == 0x67));
LAB_001069c8:
  going_accept();
  return extraout_EAX;
}

Assistant:

int going_accept(int sockfd, struct sockaddr* addr, socklen_t* addrlen)
{
	int ret_fd = 0;
	for(;;){
		ret_fd = accept(sockfd, addr, addrlen);
		if(ret_fd > 0)
			break;
		else if(ret_fd == -1){
			//由于我们把监听套接字设置为了非阻塞模式
			if(errno != EAGAIN && errno != EPROTO && 
				errno != EINTR && errno != ECONNABORTED){
				log_err("accept failed.");
				exit(-1);
			}
		}else{
			continue;
		}
	}
	return ret_fd;
}